

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# squtils.h
# Opt level: O2

void __thiscall
sqvector<SQVM::CallInfo,_unsigned_int>::resize
          (sqvector<SQVM::CallInfo,_unsigned_int> *this,size_type newsize,CallInfo *fill)

{
  uint uVar1;
  long lVar2;
  ulong uVar3;
  
  uVar3 = (ulong)newsize;
  if (this->_allocated < newsize) {
    _realloc(this,newsize);
  }
  uVar1 = this->_size;
  if (uVar1 < newsize) {
    while (uVar1 < newsize) {
      SQVM::CallInfo::CallInfo(this->_vals + uVar1,fill);
      uVar1 = this->_size + 1;
      this->_size = uVar1;
    }
  }
  else {
    lVar2 = uVar3 * 0x48 + 0x10;
    for (; uVar3 < uVar1; uVar3 = uVar3 + 1) {
      SQObjectPtr::~SQObjectPtr((SQObjectPtr *)((long)&this->_vals->_ip + lVar2));
      uVar1 = this->_size;
      lVar2 = lVar2 + 0x48;
    }
    this->_size = newsize;
  }
  return;
}

Assistant:

void resize(size_type newsize, const T& fill = T())
    {
        if(newsize > _allocated)
            _realloc(newsize);
        if(newsize > _size) {
            while(_size < newsize) {
                new ((void *)&_vals[_size]) T(fill);
                _size++;
            }
        }
        else{
            for(size_type i = newsize; i < _size; i++) {
                _vals[i].~T();
            }
            _size = newsize;
        }
    }